

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::CheckProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_> _Var5;
  string sStack_1d8;
  cmTarget *local_1b8;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> targets;
  ostringstream e;
  
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,25ul>(prop,(char (*) [25])0x41ac15);
  if (bVar1) {
    pcVar3 = GetProperty(this,prop);
    if (pcVar3 != (char *)0x0) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop,pcVar3,context,false);
    }
  }
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,34ul>
                    (prop,(char (*) [34])"IMPORTED_LINK_INTERFACE_LIBRARIES");
  if (bVar1) {
    pcVar3 = GetProperty(this,prop);
    if (pcVar3 != (char *)0x0) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop,pcVar3,context,true);
    }
  }
  bVar1 = std::operator==(prop,"INTERFACE_LINK_LIBRARIES");
  if (bVar1) {
    pcVar3 = GetProperty(this,prop);
    if (pcVar3 != (char *)0x0) {
      if (cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys == '\0') {
        iVar2 = __cxa_guard_acquire(&cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)
                                     ::keys);
        if (iVar2 != 0) {
          cmsys::RegularExpression::RegularExpression
                    ((RegularExpression *)
                     cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,
                     "(^|;)(debug|optimized|general)(;|$)");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,
                       &__dso_handle);
          __cxa_guard_release(&cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys)
          ;
        }
      }
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)
                         cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,pcVar3
                        );
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar4 = std::operator<<((ostream *)&e,
                                 "Property INTERFACE_LINK_LIBRARIES may not contain link-type keyword \""
                                );
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  (&sStack_1d8,
                   (RegularExpressionMatch *)
                   cmTargetCheckINTERFACE_LINK_LIBRARIES(char_const*,cmMakefile*)::keys,2);
        poVar4 = std::operator<<(poVar4,(string *)&sStack_1d8);
        std::operator<<(poVar4,
                        "\".  The INTERFACE_LINK_LIBRARIES property may contain configuration-sensitive generator-expressions which may be used to specify per-configuration rules."
                       );
        std::__cxx11::string::~string((string *)&sStack_1d8);
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(context,FATAL_ERROR,&sStack_1d8);
        std::__cxx11::string::~string((string *)&sStack_1d8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
    }
  }
  bVar1 = std::operator==(prop,"IMPORTED_GLOBAL");
  if ((bVar1) && (this->IsImportedTarget == true)) {
    local_1b8 = this;
    std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::vector
              (&targets,&context->ImportedTargetsOwned);
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<cmTarget**,std::vector<cmTarget*,std::allocator<cmTarget*>>>,__gnu_cxx::__ops::_Iter_equals_val<cmTarget_const*const>>
                      (targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_1b8);
    if (_Var5._M_current ==
        targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar4 = std::operator<<((ostream *)&e,"Attempt to promote imported target \"");
      poVar4 = std::operator<<(poVar4,(string *)&local_1b8->Name);
      std::operator<<(poVar4,
                      "\" to global scope (by setting IMPORTED_GLOBAL) which is not built in this directory."
                     );
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(context,FATAL_ERROR,&sStack_1d8);
      std::__cxx11::string::~string((string *)&sStack_1d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    std::_Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>::~_Vector_base
              (&targets.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>);
  }
  return;
}

Assistant:

void cmTarget::CheckProperty(const std::string& prop,
                             cmMakefile* context) const
{
  // Certain properties need checking.
  if (cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES")) {
    if (const char* value = this->GetProperty(prop)) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop, value, context, false);
    }
  }
  if (cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES")) {
    if (const char* value = this->GetProperty(prop)) {
      cmTargetCheckLINK_INTERFACE_LIBRARIES(prop, value, context, true);
    }
  }
  if (prop == "INTERFACE_LINK_LIBRARIES") {
    if (const char* value = this->GetProperty(prop)) {
      cmTargetCheckINTERFACE_LINK_LIBRARIES(value, context);
    }
  }
  if (prop == "IMPORTED_GLOBAL") {
    if (this->IsImported()) {
      cmTargetCheckIMPORTED_GLOBAL(this, context);
    }
  }
}